

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

void __thiscall clip_ctx::~clip_ctx(clip_ctx *this)

{
  pointer ppgVar1;
  pointer ppgVar2;
  pointer puVar3;
  pointer pcVar4;
  pointer piVar5;
  
  ggml_backend_free(this->backend);
  if (this->backend != this->backend_cpu) {
    ggml_backend_free();
  }
  std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::~unique_ptr(&this->sched);
  std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr(&this->buf);
  ppgVar1 = (this->backend_buft).
            super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppgVar1 != (pointer)0x0) {
    operator_delete(ppgVar1,(long)(this->backend_buft).
                                  super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppgVar1
                   );
  }
  ppgVar2 = (this->backend_ptrs).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppgVar2 != (pointer)0x0) {
    operator_delete(ppgVar2,(long)(this->backend_ptrs).
                                  super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppgVar2
                   );
  }
  puVar3 = (this->buf_compute_meta).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->buf_compute_meta).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr(&this->ctx_data);
  std::unique_ptr<gguf_context,_gguf_context_deleter>::~unique_ptr(&this->ctx_gguf);
  pcVar4 = (this->vision_model).layers.super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4,(long)(this->vision_model).layers.
                                 super__Vector_base<clip_layer,_std::allocator<clip_layer>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pcVar4);
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->vision_model).hparams.vision_feature_layer._M_h);
  piVar5 = (this->vision_model).hparams.image_grid_pinpoints.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5,(long)(this->vision_model).hparams.image_grid_pinpoints.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar5);
    return;
  }
  return;
}

Assistant:

~clip_ctx() {
        ggml_backend_free(backend);
        if (backend != backend_cpu) {
            ggml_backend_free(backend_cpu);
        }
    }